

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rmlLinkedMap.c
# Opt level: O0

void * rmlLinkedMapRemove(void *self,char *key)

{
  void *item_00;
  rmlLinkedMapKeyValuePair_ *self_00;
  void *local_38;
  void *value;
  rmlLinkedMapKeyValuePair_ *pair;
  void *item;
  char *key_local;
  void *self_local;
  
  item_00 = rmlLinkedMapGetPairItem(self,key);
  self_00 = (rmlLinkedMapKeyValuePair_ *)rmlLinkedListItemGetValue(item_00);
  if (self_00 == (rmlLinkedMapKeyValuePair_ *)0x0) {
    local_38 = (void *)0x0;
  }
  else {
    local_38 = self_00->value;
  }
  rmlLinkedMapKeyValuePairDestroy(self_00);
  rmlLinkedListRemoveItem(self,item_00);
  return local_38;
}

Assistant:

void *rmlLinkedMapRemove(void *self, char *key) {
    void *item = rmlLinkedMapGetPairItem(self, key);
    struct rmlLinkedMapKeyValuePair_ *pair = rmlLinkedListItemGetValue(item);

    void *value = pair != NULL ? pair->value : NULL;

    rmlLinkedMapKeyValuePairDestroy(pair);
    rmlLinkedListRemoveItem(self, item);
    return value;
}